

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O0

bool __thiscall dh::scanner::scan(scanner *this,FILE *fp)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  __normal_iterator<dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_> local_4f8;
  token *local_4f0;
  string local_4e8 [32];
  token local_4c8;
  string local_4a0 [32];
  token local_480;
  string local_458 [32];
  token local_438;
  string local_410 [32];
  token local_3f0;
  string local_3c8 [32];
  token local_3a8;
  string local_380 [32];
  token local_360;
  string local_338 [32];
  token local_318;
  string local_2f0 [32];
  token local_2d0;
  string local_2a8 [32];
  token local_288;
  string local_260 [32];
  token local_240;
  string local_218 [32];
  token local_1f8;
  string local_1d0 [32];
  token local_1b0;
  string local_188 [32];
  token local_168;
  string local_140 [32];
  token local_120;
  string local_f8 [32];
  token local_d8;
  string local_b0 [32];
  token local_90;
  TYPE local_64;
  undefined4 local_60;
  TYPE tmp_type;
  allocator local_49;
  string local_48 [8];
  string tmp;
  char local_26;
  char local_25;
  undefined4 local_24;
  char lastch;
  char cur;
  STATE state;
  FILE *fp_local;
  scanner *this_local;
  
  reset(this);
  local_24 = 0;
  local_26 = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (fp == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = fgetc((FILE *)fp);
    local_25 = (char)iVar2;
    while (local_25 == ' ' || local_25 == '\t') {
      iVar2 = fgetc((FILE *)fp);
      local_25 = (char)iVar2;
    }
LAB_00128e2b:
    if (local_25 != -1) {
      if ((local_25 == '\n') && (local_26 != '\r')) {
        this->line = this->line + 1;
      }
      else if (local_25 == '\r') {
        this->line = this->line + 1;
      }
      switch(local_24) {
      case 0:
        if ((((local_25 == ' ') || (local_25 == '\t')) || (local_25 == '\r')) || (local_25 == '\n'))
        {
          local_24 = 0;
        }
        else if (((local_25 == '_') || (('`' < local_25 && (local_25 < '{')))) ||
                (('@' < local_25 && (local_25 < '[')))) {
          local_24 = 1;
          std::__cxx11::string::operator+=(local_48,local_25);
        }
        else if ((local_25 < '0') || ('9' < local_25)) {
          if (local_25 == '\"') {
            local_24 = 4;
            std::__cxx11::string::operator+=(local_48,'\"');
          }
          else if (local_25 == '.') {
            local_24 = 3;
            std::__cxx11::string::operator+=(local_48,'.');
          }
          else {
            local_24 = 5;
          }
        }
        else {
          local_24 = 2;
          std::__cxx11::string::operator+=(local_48,local_25);
        }
        local_26 = local_25;
        break;
      case 1:
        if ((((local_25 == '_') || (('`' < local_25 && (local_25 < '{')))) ||
            (('@' < local_25 && (local_25 < '[')))) || (('/' < local_25 && (local_25 < ':')))) {
          local_24 = 1;
          std::__cxx11::string::operator+=(local_48,local_25);
        }
        else {
          local_24 = 5;
          local_64 = 0x1b;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"boolean");
          if (bVar1) {
            local_64 = BOOLEAN;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"break");
            if (bVar1) {
              local_64 = BREAK;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_48,"continue");
              if (bVar1) {
                local_64 = CONTINUE;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_48,"else");
                if (bVar1) {
                  local_64 = ELSE;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_48,"for");
                  if (bVar1) {
                    local_64 = FOR;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_48,"float");
                    if (bVar1) {
                      local_64 = FLOAT;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_48,"if");
                      if (bVar1) {
                        local_64 = IF;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_48,"int");
                        if (bVar1) {
                          local_64 = INT;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_48,"return");
                          if (bVar1) {
                            local_64 = RETURN;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_48,"void");
                            if (bVar1) {
                              local_64 = VOID;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_48,"while");
                              if (bVar1) {
                                local_64 = WHILE;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_48,"true");
                                if ((bVar1) ||
                                   (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_48,"false"), bVar1)) {
                                  local_64 = NUMBOOLEAN;
                                }
                                else {
                                  local_64 = ID;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          std::__cxx11::string::string(local_b0,local_48);
          token::token(&local_90,(string *)local_b0,local_64,this->line);
          std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_90);
          token::~token(&local_90);
          std::__cxx11::string::~string(local_b0);
          std::__cxx11::string::clear();
        }
        local_26 = local_25;
        break;
      case 2:
        if ((local_25 < '0') || ('9' < local_25)) {
          if (local_25 == '.') {
            local_24 = 3;
            std::__cxx11::string::operator+=(local_48,'.');
          }
          else if ((local_25 == 'E') || (local_25 == 'e')) {
            std::__cxx11::string::operator+=(local_48,local_25);
            local_24 = 3;
          }
          else {
            local_24 = 5;
            std::__cxx11::string::string(local_f8,local_48);
            token::token(&local_d8,(string *)local_f8,NUMINT,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_d8);
            token::~token(&local_d8);
            std::__cxx11::string::~string(local_f8);
            std::__cxx11::string::clear();
          }
        }
        else {
          std::__cxx11::string::operator+=(local_48,local_25);
          local_24 = 2;
        }
        local_26 = local_25;
        break;
      case 3:
        if (local_26 == '.') {
          if ((local_25 < '0') || ('9' < local_25)) {
            local_24 = 5;
            std::__cxx11::string::string(local_140,local_48);
            token::token(&local_120,(string *)local_140,NUMFLOAT,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_120)
            ;
            token::~token(&local_120);
            std::__cxx11::string::~string(local_140);
            std::__cxx11::string::clear();
          }
          else {
            std::__cxx11::string::operator+=(local_48,local_25);
            local_24 = 3;
          }
        }
        else if ((local_26 == 'E') || (local_26 == 'e')) {
          if ((local_25 == '+') || (local_25 == '-')) {
            local_24 = 3;
            std::__cxx11::string::operator+=(local_48,local_25);
          }
          else if ((local_25 < '0') || ('9' < local_25)) {
            local_24 = 0;
            poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Incompleted float-literal \"");
            poVar3 = std::operator<<(poVar3,local_48);
            poVar3 = std::operator<<(poVar3,"\" near line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::clear();
            this->rightflag = false;
          }
          else {
            local_24 = 3;
            std::__cxx11::string::operator+=(local_48,local_25);
          }
        }
        else if ((local_26 < '0') || ('9' < local_26)) {
          if ((local_26 == '+') || (local_26 == '-')) {
            if ((local_25 < '0') || ('9' < local_25)) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Incompleted float-literal \"")
              ;
              poVar3 = std::operator<<(poVar3,local_48);
              poVar3 = std::operator<<(poVar3,"\" near line ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line);
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::clear();
              this->rightflag = false;
              local_24 = 0;
            }
            else {
              std::__cxx11::string::operator+=(local_48,local_25);
              local_24 = 3;
            }
          }
        }
        else if ((local_25 == 'E') || (local_25 == 'e')) {
          std::__cxx11::string::operator+=(local_48,local_25);
          local_24 = 3;
        }
        else if ((local_25 < '0') || ('9' < local_25)) {
          local_24 = 5;
          std::__cxx11::string::string(local_188,local_48);
          token::token(&local_168,(string *)local_188,NUMFLOAT,this->line);
          std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_168);
          token::~token(&local_168);
          std::__cxx11::string::~string(local_188);
          std::__cxx11::string::clear();
        }
        else {
          std::__cxx11::string::operator+=(local_48,local_25);
          local_24 = 3;
        }
        local_26 = local_25;
        break;
      case 4:
        if ((local_25 == '\"') && (local_26 != '\\')) {
          local_24 = 0;
          std::__cxx11::string::string(local_1d0,local_48);
          token::token(&local_1b0,(string *)local_1d0,STRING,this->line);
          std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_1b0);
          token::~token(&local_1b0);
          std::__cxx11::string::~string(local_1d0);
          std::__cxx11::string::clear();
        }
        else {
          local_24 = 4;
          if ((local_25 != '\n') && (local_25 != '\r')) {
            std::__cxx11::string::operator+=(local_48,local_25);
          }
        }
        local_26 = local_25;
        break;
      case 5:
        switch(local_26) {
        case '\t':
        case '\n':
        case '\r':
        case ' ':
          break;
        default:
          poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Unexpected Token \"");
          poVar3 = std::operator<<(poVar3,local_26);
          poVar3 = std::operator<<(poVar3,"\" in line ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          this->rightflag = false;
          break;
        case '!':
          if (local_25 == '=') {
            std::__cxx11::string::clear();
            std::__cxx11::string::operator=(local_48,"!=");
            std::__cxx11::string::string(local_2a8,local_48);
            token::token(&local_288,(string *)local_2a8,EQUOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_288)
            ;
            token::~token(&local_288);
            std::__cxx11::string::~string(local_2a8);
            std::__cxx11::string::clear();
            iVar2 = fgetc((FILE *)fp);
            local_25 = (char)iVar2;
          }
          else {
            std::__cxx11::string::clear();
            std::__cxx11::string::operator=(local_48,local_26);
            std::__cxx11::string::string(local_2f0,local_48);
            token::token(&local_2d0,(string *)local_2f0,LOGICALOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_2d0)
            ;
            token::~token(&local_2d0);
            std::__cxx11::string::~string(local_2f0);
            std::__cxx11::string::clear();
          }
          break;
        case '&':
          if (local_25 == '&') {
            std::__cxx11::string::clear();
            std::__cxx11::string::operator=(local_48,"&&");
            std::__cxx11::string::string(local_410,local_48);
            token::token(&local_3f0,(string *)local_410,LOGICALOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_3f0)
            ;
            token::~token(&local_3f0);
            std::__cxx11::string::~string(local_410);
            std::__cxx11::string::clear();
            iVar2 = fgetc((FILE *)fp);
            local_25 = (char)iVar2;
          }
          else {
            std::__cxx11::string::clear();
            poVar3 = std::operator<<((ostream *)&std::cerr,
                                     "[ERROR] Incompleted Logical operator \"&\"");
            poVar3 = std::operator<<(poVar3," near line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            this->rightflag = false;
          }
          break;
        case '(':
        case ')':
        case ',':
        case ';':
        case '[':
        case ']':
        case '{':
        case '}':
          std::__cxx11::string::clear();
          std::__cxx11::string::operator=(local_48,local_26);
          std::__cxx11::string::string(local_4e8,local_48);
          token::token(&local_4c8,(string *)local_4e8,SEPOP,this->line);
          std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_4c8);
          token::~token(&local_4c8);
          std::__cxx11::string::~string(local_4e8);
          std::__cxx11::string::clear();
          break;
        case '*':
switchD_00129a65_caseD_2a:
          std::__cxx11::string::clear();
          std::__cxx11::string::operator=(local_48,local_26);
          std::__cxx11::string::string(local_458,local_48);
          token::token(&local_438,(string *)local_458,MULOP,this->line);
          std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_438);
          token::~token(&local_438);
          std::__cxx11::string::~string(local_458);
          std::__cxx11::string::clear();
          break;
        case '+':
        case '-':
          std::__cxx11::string::clear();
          std::__cxx11::string::operator=(local_48,local_26);
          std::__cxx11::string::string(local_4a0,local_48);
          token::token(&local_480,(string *)local_4a0,ADDOP,this->line);
          std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_480);
          token::~token(&local_480);
          std::__cxx11::string::~string(local_4a0);
          std::__cxx11::string::clear();
          break;
        case '/':
          if (local_25 == '/') {
            local_24 = 7;
          }
          else {
            if (local_25 != '*') goto switchD_00129a65_caseD_2a;
            local_24 = 6;
          }
          goto LAB_00128e2b;
        case '<':
        case '>':
          if (local_25 == '=') {
            std::__cxx11::string::clear();
            std::__cxx11::string::operator=(local_48,local_26 + '=');
            std::__cxx11::string::string(local_338,local_48);
            token::token(&local_318,(string *)local_338,RELOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_318)
            ;
            token::~token(&local_318);
            std::__cxx11::string::~string(local_338);
            std::__cxx11::string::clear();
            iVar2 = fgetc((FILE *)fp);
            local_25 = (char)iVar2;
          }
          else {
            std::__cxx11::string::clear();
            std::__cxx11::string::operator=(local_48,local_26);
            std::__cxx11::string::string(local_380,local_48);
            token::token(&local_360,(string *)local_380,RELOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_360)
            ;
            token::~token(&local_360);
            std::__cxx11::string::~string(local_380);
            std::__cxx11::string::clear();
          }
          break;
        case '=':
          if (local_25 == '=') {
            std::__cxx11::string::clear();
            std::__cxx11::string::operator=(local_48,local_26 + '=');
            std::__cxx11::string::string(local_218,local_48);
            token::token(&local_1f8,(string *)local_218,EQUOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_1f8)
            ;
            token::~token(&local_1f8);
            std::__cxx11::string::~string(local_218);
            std::__cxx11::string::clear();
            iVar2 = fgetc((FILE *)fp);
            local_25 = (char)iVar2;
          }
          else {
            std::__cxx11::string::clear();
            std::__cxx11::string::operator=(local_48,local_26);
            std::__cxx11::string::string(local_260,local_48);
            token::token(&local_240,(string *)local_260,ASSINGOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_240)
            ;
            token::~token(&local_240);
            std::__cxx11::string::~string(local_260);
            std::__cxx11::string::clear();
          }
          break;
        case '|':
          if (local_25 == '|') {
            std::__cxx11::string::clear();
            std::__cxx11::string::operator=(local_48,"||");
            std::__cxx11::string::string(local_3c8,local_48);
            token::token(&local_3a8,(string *)local_3c8,LOGICALOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::push_back(&this->_tokens,&local_3a8)
            ;
            token::~token(&local_3a8);
            std::__cxx11::string::~string(local_3c8);
            std::__cxx11::string::clear();
            iVar2 = fgetc((FILE *)fp);
            local_25 = (char)iVar2;
          }
          else {
            std::__cxx11::string::clear();
            poVar3 = std::operator<<((ostream *)&std::cerr,
                                     "[ERROR] Incompleted Logical operator \"|\"");
            poVar3 = std::operator<<(poVar3," near line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            this->rightflag = false;
          }
        }
        if ((local_25 == '\n') || (local_25 == '\r')) {
          this->line = this->line + -1;
        }
        local_24 = 0;
        goto LAB_00128e2b;
      case 6:
        if ((local_26 == '*') && (local_25 == '/')) {
          local_24 = 0;
        }
        else {
          local_24 = 6;
        }
        local_26 = local_25;
        break;
      case 7:
        if ((local_25 == '\r') || (local_25 == '\n')) {
          local_24 = 0;
        }
        else {
          local_24 = 7;
        }
        local_26 = local_25;
      }
      iVar2 = fgetc((FILE *)fp);
      local_25 = (char)iVar2;
      goto LAB_00128e2b;
    }
    local_4f8._M_current =
         (token *)std::vector<dh::token,_std::allocator<dh::token>_>::begin(&this->_tokens);
    __gnu_cxx::__normal_iterator<dh::token_const*,std::vector<dh::token,std::allocator<dh::token>>>
    ::__normal_iterator<dh::token*>
              ((__normal_iterator<dh::token_const*,std::vector<dh::token,std::allocator<dh::token>>>
                *)&local_4f0,&local_4f8);
    (this->_it)._M_current = local_4f0;
    this->scanflag = true;
    fclose((FILE *)fp);
    this_local._7_1_ = true;
  }
  local_60 = 1;
  std::__cxx11::string::~string(local_48);
  return this_local._7_1_;
}

Assistant:

bool scanner::scan(::std::FILE *fp)
{
	this->reset();

	STATE state = STATE::START;
	char cur = 0;
	char lastch = 0;
	::std::string tmp = "";

	if ( fp == NULL)
	{
		return false;
	}

	cur = ::std::fgetc(fp);
	while( cur == ' ' || cur == '\t') cur = ::std::fgetc(fp);

	// DFA implement
	while( cur != EOF)
	{
		if ( cur == '\n' && lastch != '\r')
		{
			++line;
		} else if ( cur == '\r')
		{
			++line;
		}

		// core part
		switch(state)
		{
			case STATE::START:
				if ( cur == ' ' || cur == '\t'
						|| cur == '\r' || cur == '\n')
				{
					state = STATE::START;
				} else if ( cur == '_' 
						|| ( cur >= 'a' && cur <= 'z')
						|| ( cur >= 'A' && cur <= 'Z'))
				{
					state = STATE::INID;
					tmp += cur;
				} else if ( cur >= '0' && cur <= '9')
				{
					state = STATE::ININT;
					tmp += cur;
				} else if ( cur == '\"') 
				{
					state = STATE::INSTRING;
					tmp += cur;
				} else if ( cur == '.') 
				{
					state = STATE::INFLOAT;
					tmp += cur;
				}
				else 
				{
					state = STATE::DONE;
				}
				lastch = cur;
				break;
			case INID:
				if ( cur == '_'
						|| ( cur >= 'a' && cur <= 'z')
						|| ( cur >= 'A' && cur <= 'Z')
						|| ( cur >= '0' && cur <= '9'))
				{
					state = STATE::INID;
					tmp += cur;
				} else 
				{
					state = STATE::DONE;
					
					TYPE tmp_type = TYPE::ID;
					if ( tmp == "boolean")
					{
						tmp_type = TYPE::BOOLEAN;
					} else if ( tmp == "break")
					{
						tmp_type = TYPE::BREAK;
					} else if ( tmp == "continue")
					{
						tmp_type = TYPE::CONTINUE;
					} else if ( tmp == "else")
					{
						tmp_type = TYPE::ELSE;
					} else if ( tmp == "for")
					{
						tmp_type = TYPE::FOR;
					} else if ( tmp == "float")
					{
						tmp_type = TYPE::FLOAT;
					} else if ( tmp == "if")
					{
						tmp_type = TYPE::IF;
					} else if ( tmp == "int")
					{
						tmp_type = TYPE::INT;
					} else if ( tmp == "return")
					{
						tmp_type = TYPE::RETURN;
					} else if ( tmp == "void")
					{
						tmp_type = TYPE::VOID;
					} else if ( tmp == "while")
					{
						tmp_type = TYPE::WHILE;
					} else if ( tmp == "true" || tmp == "false")
					{
						tmp_type = TYPE::NUMBOOLEAN;
					} else 
					{
						tmp_type = TYPE::ID;
					}
					_tokens.push_back( token( tmp, tmp_type, line));
					tmp.clear();
				}
				lastch = cur;
				break;
			case STATE::ININT:
				if ( cur >= '0' && cur <= '9')
				{
					tmp += cur;
					state = STATE::ININT;
				} else if ( cur == '.')
				{
					state = STATE::INFLOAT;
					tmp += cur;
				} else if ( cur == 'E' || cur == 'e')
				{
					tmp += cur;
					state = STATE::INFLOAT;
				} else 
				{
					state = STATE::DONE;
					
					_tokens.push_back( token( tmp, TYPE::NUMINT, line));
					tmp.clear();
				}
				lastch = cur;
				break;
			case STATE::INFLOAT:
				if ( lastch == '.')
				{
					if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else 
					{
						state = STATE::DONE;

						_tokens.push_back( token( tmp, TYPE::NUMFLOAT, line));
						tmp.clear();
					}
				} else if ( lastch == 'E' || lastch == 'e')
				{
					if ( cur == '+' || cur == '-')
					{
						state = STATE::INFLOAT;
						tmp += cur;
					} else if ( cur >= '0' && cur <= '9')
					{
						state = STATE::INFLOAT;
						tmp += cur;
					} else 
					{
						state = STATE::START;
						::std::cerr << "[ERROR] Incompleted float-literal \"" 
							<< tmp
							<< "\" near line " 
							<< line << ::std::endl;
						tmp.clear();
						rightflag = false;
					}
				} else if( lastch >= '0' && lastch <= '9')
				{
					if ( cur == 'E' || cur == 'e')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else
					{
						state = STATE::DONE;
						_tokens.push_back( token( tmp, TYPE::NUMFLOAT, line));
						tmp.clear();
					}
				} else if ( lastch == '+' || lastch == '-')
				{
					if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else 
					{
						::std::cerr << "[ERROR] Incompleted float-literal \""
							<< tmp
							<< "\" near line "
							<< line
							<< ::std::endl;
						tmp.clear();
						rightflag = false;
						state = STATE::START;
					}
				}
				lastch = cur;
				break;
			case STATE::INMULTICOMMENT:
				if ( lastch == '*' && cur == '/')
				{
					state = STATE::START;
				} else 
				{
					state = STATE::INMULTICOMMENT;
				}
				lastch = cur;
				break;
			case STATE::INSINGLECOMMENT:
				if (cur == '\r' || cur == '\n')
				{
					state = STATE::START;
				} else 
				{
					state = STATE::INSINGLECOMMENT;
				}
				lastch = cur;
				break;
			case STATE::INSTRING:
				if ( cur == '\"' && lastch != '\\')
				{
					state = STATE::START;

					_tokens.push_back( token( tmp, TYPE::STRING, line));
					tmp.clear();
				} else 
				{
					state = STATE::INSTRING;
					if ( cur != '\n' && cur != '\r')
					{
						tmp += cur;
					}
				}
				lastch = cur;
				break;
			case STATE::DONE:
				switch(lastch)
				{
					case ' ':
					case '\t':
					case '\r':
					case '\n':
						break;
					case '=':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = lastch + cur;

							_tokens.push_back( token( tmp, TYPE::EQUOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::ASSINGOP, line));
							tmp.clear();
						}
						break;
					case '!':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = "!=";

							_tokens.push_back( token( tmp, TYPE::EQUOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();
						}
						break;
					case '>':
					case '<':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = lastch + cur;

							_tokens.push_back( token( tmp, TYPE::RELOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::RELOP, line));
							tmp.clear();
						}
						break;
					case '|':
						if ( cur == '|')
						{
							tmp.clear();
							tmp = "||";

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							::std::cerr << "[ERROR] Incompleted Logical operator \"|\""
								<< " near line " 
								<< line
								<< ::std::endl;
							rightflag = false;
						}
						break;
					case '&':
						if ( cur == '&')
						{
							tmp.clear();
							tmp = "&&";

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							::std::cerr << "[ERROR] Incompleted Logical operator \"&\""
								<< " near line " 
								<< line
								<< ::std::endl;
							rightflag = false;
						}
						break;
					case '/':
						if ( cur == '/')
						{
							state = STATE::INSINGLECOMMENT;
							continue;
						} else if ( cur == '*'){
							state = STATE::INMULTICOMMENT;
							continue;
						}
					case '*':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::MULOP, line));
						tmp.clear();
						break;
					case '+':
					case '-':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::ADDOP, line));
						tmp.clear();
						break;
					case '{':
					case '}':
					case '[':
					case ']':
					case '(':
					case ')':
					case ',':
					case ';':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::SEPOP, line));
						tmp.clear();
						break;
					default:
						::std::cerr << "[ERROR] Unexpected Token \""
							<< lastch
							<< "\" in line "
							<< line
							<< ::std::endl;
						rightflag = false;
						break;
				}
				if (cur == '\n' || cur == '\r')
				{
					--line;
				}
				state = STATE::START;
				continue;
		}
		cur = ::std::fgetc(fp);
	}
	_it = _tokens.begin();
	scanflag = true;;
	fclose(fp);
	return true;
}